

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O2

void __thiscall RK_Individual::calculaFuncaoObjetivoOtimizado(RK_Individual *this,Graph *g)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vertex *pVVar4;
  reference ppCVar5;
  Edge *pEVar6;
  double *pdVar7;
  Graph *pGVar8;
  int iVar9;
  int i;
  size_type sVar10;
  double dVar11;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x104fde);
  for (sVar10 = 0; (long)sVar10 < (long)this->number_of_edges; sVar10 = sVar10 + 1) {
    dVar11 = this->weights[sVar10];
    ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
    (*ppCVar5)->weight = dVar11;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x104fd0);
  uVar1 = g->numberOfNonModifiable;
  iVar2 = g->verticesSize;
  sVar10 = 0;
  iVar9 = 0;
  while (iVar9 < (int)(~uVar1 + iVar2)) {
    ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
    iVar3 = (*ppCVar5)->edge->origin->idTree;
    ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
    if (iVar3 != (*ppCVar5)->edge->destiny->idTree) {
      ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
      if ((*ppCVar5)->edge->closed == false) {
        ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
        iVar3 = (*ppCVar5)->edge->origin->idTree;
        pGVar8 = g;
        while (pVVar4 = pGVar8->verticesList, pVVar4 != (Vertex *)0x0) {
          if (pVVar4->idTree == iVar3) {
            ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                                (&cromossomos,sVar10);
            pVVar4->idTree = (*ppCVar5)->edge->destiny->idTree;
          }
          pGVar8 = (Graph *)&pVVar4->nextVertex;
        }
        ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
        (*ppCVar5)->edge->closed = true;
        ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
        iVar3 = (*ppCVar5)->edge->destiny->id;
        ppCVar5 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&cromossomos,sVar10);
        pEVar6 = Graph::findEdge(g,iVar3,(*ppCVar5)->edge->origin->id);
        pEVar6->closed = true;
        iVar9 = iVar9 + 1;
      }
    }
    sVar10 = sVar10 + 1;
  }
  Graph::defineFlows(g);
  Graph::evaluateLossesAndFlows(g,1e-08,0);
  pdVar7 = Graph::getLossesReseting(g);
  this->active_loss = *pdVar7;
  dVar11 = pdVar7[1];
  this->reactive_loss = dVar11;
  if (NAN(*pdVar7)) {
    this->active_loss = 9999999999.0;
    dVar11 = pdVar7[1];
  }
  if (NAN(dVar11)) {
    this->reactive_loss = 9999999999.0;
  }
  operator_delete(pdVar7,8);
  return;
}

Assistant:

void RK_Individual::calculaFuncaoObjetivoOtimizado(Graph *g){

    /** colocar os cromossomos na ordem correta em que aparecem no grafo antes de associar os pesos **/
    sort(cromossomos.begin(), cromossomos.end(), ordenaPosicaoCromossomo);

    /** copia peso do individio paca cada cromossomo **/
    for(int i=0; i<this->getNumEdges(); i++)
        cromossomos.at(i)->weight = this->weights[i];

    sort(cromossomos.begin(), cromossomos.end(), sortChromosome);

    int n_arc_inseridos = 0, n_arcos_inserir = g->getVerticesSize() - 1 - g->getNumberOfNonModifiable();


    /** percorre vetor de cromossomos ordenados e tenta fechar chave(algoritmo de kruskal) **/
    for(int i=0; n_arc_inseridos<n_arcos_inserir; i++){

        if((cromossomos.at(i)->edge->getOrigin()->getIdTree() != cromossomos.at(i)->edge->getDestiny()->getIdTree()) &&
                cromossomos.at(i)->edge->isClosed() == false){

            int id = cromossomos.at(i)->edge->getOrigin()->getIdTree();
            for(Vertex *no = g->get_verticesList(); no != NULL; no = no->getNext()){
                if(no->getIdTree() == id)
                    no->setIdTree(cromossomos.at(i)->edge->getDestiny()->getIdTree());
            }

            cromossomos.at(i)->edge->setSwitch(true);
            g->findEdge(cromossomos.at(i)->edge->getDestiny()->getID(),
                        cromossomos.at(i)->edge->getOrigin()->getID())->setSwitch(true);

            n_arc_inseridos++;
        }

    }


    g->defineFlows();
    g->evaluateLossesAndFlows(1e-8); /** calcula fluxos e perda com erro de 1e-5 **/

    double *perdas = g->getLossesReseting();/** soma as perdas ativas e reativas em todos os arcos e retorna um double* **/

    this->active_loss = perdas[0];
    this->reactive_loss = perdas[1];

    /** no caso de solucoes que possuem configuracao viavel porem sao muito longas **/
    if(isnan(perdas[0]))
        this->active_loss = 9999999999;

    if(isnan(perdas[1]))
        this->reactive_loss = 9999999999;

    delete perdas;
}